

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O3

void array_suite::test_integer_many(void)

{
  bool bVar1;
  int iVar2;
  reader reader;
  char input [8];
  uint local_174;
  view_type local_170;
  basic_reader<char> local_160;
  char local_18 [8];
  
  builtin_strncpy(local_18,"[1,2,3]",8);
  local_170._M_len = strlen(local_18);
  local_170._M_str = local_18;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_160,&local_170);
  local_170._M_len = CONCAT44(local_170._M_len._4_4_,local_160.decoder.current.code);
  local_174 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x14e,"void array_suite::test_integer_many()",&local_170,&local_174);
  if ((long)local_160.stack.c.
            super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_160.stack.c.
            super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    local_170._M_len =
         ((long)local_160.stack.c.
                super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_160.stack.c.
                super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
    local_174 = 1;
    boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
              ("reader.level()","1",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x14f,"void array_suite::test_integer_many()",&local_170,&local_174);
    local_170._M_len =
         (long)local_160.decoder.current.view.tail - (long)local_160.decoder.current.view.head;
    local_170._M_str = local_160.decoder.current.view.head;
    boost::detail::
    test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
              ("reader.literal()","\"[\"",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x150,"void array_suite::test_integer_many()",&local_170,"[");
    local_170._M_len = (long)local_160.decoder.input.tail - (long)local_160.decoder.input.head;
    local_170._M_str = local_160.decoder.input.head;
    boost::detail::
    test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[7]>
              ("reader.tail()","\"1,2,3]\"",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x151,"void array_suite::test_integer_many()",&local_170,"1,2,3]");
    bVar1 = trial::protocol::json::basic_reader<char>::next(&local_160);
    local_170._M_len = CONCAT71(local_170._M_len._1_7_,bVar1);
    local_174 = CONCAT31(local_174._1_3_,1);
    boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
              ("reader.next()","true",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x153,"void array_suite::test_integer_many()",&local_170,&local_174);
    local_174 = 8;
    boost::detail::
    test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
              ("reader.code()","token::code::integer",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x154,"void array_suite::test_integer_many()",&local_170,&local_174);
    iVar2 = trial::protocol::json::basic_reader<char>::value<int>(&local_160);
    local_170._M_len = CONCAT44(local_170._M_len._4_4_,iVar2);
    local_174 = 1;
    boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
              ("reader.value<int>()","1",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
               ,0x155,"void array_suite::test_integer_many()",&local_170,&local_174);
    if ((long)local_160.stack.c.
              super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_160.stack.c.
              super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      local_170._M_len =
           ((long)local_160.stack.c.
                  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_160.stack.c.
                  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
      local_174 = 1;
      boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
                ("reader.level()","1",
                 "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                 ,0x156,"void array_suite::test_integer_many()",&local_170,&local_174);
      local_170._M_len =
           (long)local_160.decoder.current.view.tail - (long)local_160.decoder.current.view.head;
      local_170._M_str = local_160.decoder.current.view.head;
      boost::detail::
      test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
                ("reader.literal()","\"1\"",
                 "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                 ,0x157,"void array_suite::test_integer_many()",&local_170,"1");
      local_170._M_len = (long)local_160.decoder.input.tail - (long)local_160.decoder.input.head;
      local_170._M_str = local_160.decoder.input.head;
      boost::detail::
      test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[6]>
                ("reader.tail()","\",2,3]\"",
                 "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                 ,0x158,"void array_suite::test_integer_many()",&local_170,",2,3]");
      bVar1 = trial::protocol::json::basic_reader<char>::next(&local_160);
      local_170._M_len = CONCAT71(local_170._M_len._1_7_,bVar1);
      local_174 = CONCAT31(local_174._1_3_,1);
      boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
                ("reader.next()","true",
                 "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                 ,0x15a,"void array_suite::test_integer_many()",&local_170,&local_174);
      local_174 = 8;
      boost::detail::
      test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
                ("reader.code()","token::code::integer",
                 "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                 ,0x15b,"void array_suite::test_integer_many()",&local_170,&local_174);
      iVar2 = trial::protocol::json::basic_reader<char>::value<int>(&local_160);
      local_170._M_len = CONCAT44(local_170._M_len._4_4_,iVar2);
      local_174 = 2;
      boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
                ("reader.value<int>()","2",
                 "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                 ,0x15c,"void array_suite::test_integer_many()",&local_170,&local_174);
      if ((long)local_160.stack.c.
                super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_160.stack.c.
                super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        local_170._M_len =
             ((long)local_160.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_160.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
        local_174 = 1;
        boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
                  ("reader.level()","1",
                   "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                   ,0x15d,"void array_suite::test_integer_many()",&local_170,&local_174);
        local_170._M_len =
             (long)local_160.decoder.current.view.tail - (long)local_160.decoder.current.view.head;
        local_170._M_str = local_160.decoder.current.view.head;
        boost::detail::
        test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
                  ("reader.literal()","\"2\"",
                   "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                   ,0x15e,"void array_suite::test_integer_many()",&local_170,"2");
        local_170._M_len = (long)local_160.decoder.input.tail - (long)local_160.decoder.input.head;
        local_170._M_str = local_160.decoder.input.head;
        boost::detail::
        test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[4]>
                  ("reader.tail()","\",3]\"",
                   "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                   ,0x15f,"void array_suite::test_integer_many()",&local_170,",3]");
        bVar1 = trial::protocol::json::basic_reader<char>::next(&local_160);
        local_170._M_len = CONCAT71(local_170._M_len._1_7_,bVar1);
        local_174 = CONCAT31(local_174._1_3_,1);
        boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
                  ("reader.next()","true",
                   "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                   ,0x161,"void array_suite::test_integer_many()",&local_170,&local_174);
        local_174 = 8;
        boost::detail::
        test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
                  ("reader.code()","token::code::integer",
                   "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                   ,0x162,"void array_suite::test_integer_many()",&local_170,&local_174);
        iVar2 = trial::protocol::json::basic_reader<char>::value<int>(&local_160);
        local_170._M_len = CONCAT44(local_170._M_len._4_4_,iVar2);
        local_174 = 3;
        boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
                  ("reader.value<int>()","3",
                   "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                   ,0x163,"void array_suite::test_integer_many()",&local_170,&local_174);
        if ((long)local_160.stack.c.
                  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_160.stack.c.
                  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0) {
          local_170._M_len =
               ((long)local_160.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_160.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
          local_174 = 1;
          boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
                    ("reader.level()","1",
                     "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                     ,0x164,"void array_suite::test_integer_many()",&local_170,&local_174);
          local_170._M_len =
               (long)local_160.decoder.current.view.tail - (long)local_160.decoder.current.view.head
          ;
          local_170._M_str = local_160.decoder.current.view.head;
          boost::detail::
          test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
                    ("reader.literal()","\"3\"",
                     "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                     ,0x165,"void array_suite::test_integer_many()",&local_170,"3");
          local_170._M_len = (long)local_160.decoder.input.tail - (long)local_160.decoder.input.head
          ;
          local_170._M_str = local_160.decoder.input.head;
          boost::detail::
          test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
                    ("reader.tail()","\"]\"",
                     "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                     ,0x166,"void array_suite::test_integer_many()",&local_170,"]");
          bVar1 = trial::protocol::json::basic_reader<char>::next(&local_160);
          local_170._M_len = CONCAT71(local_170._M_len._1_7_,bVar1);
          local_174 = CONCAT31(local_174._1_3_,1);
          boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
                    ("reader.next()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                     ,0x168,"void array_suite::test_integer_many()",&local_170,&local_174);
          local_170._M_len = CONCAT44(local_170._M_len._4_4_,local_160.decoder.current.code);
          local_174 = 0xd;
          boost::detail::
          test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
                    ("reader.code()","token::code::end_array",
                     "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                     ,0x169,"void array_suite::test_integer_many()",&local_170,&local_174);
          if ((long)local_160.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_160.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0) {
            local_170._M_len =
                 ((long)local_160.stack.c.
                        super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_160.stack.c.
                        super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
            local_174 = 0;
            boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
                      ("reader.level()","0",
                       "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                       ,0x16a,"void array_suite::test_integer_many()",&local_170,&local_174);
            local_170._M_len =
                 (long)local_160.decoder.current.view.tail -
                 (long)local_160.decoder.current.view.head;
            local_170._M_str = local_160.decoder.current.view.head;
            boost::detail::
            test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
                      ("reader.literal()","\"]\"",
                       "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                       ,0x16b,"void array_suite::test_integer_many()",&local_170,"]");
            local_170._M_len =
                 (long)local_160.decoder.input.tail - (long)local_160.decoder.input.head;
            local_170._M_str = local_160.decoder.input.head;
            boost::detail::
            test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[1]>
                      ("reader.tail()","\"\"",
                       "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                       ,0x16c,"void array_suite::test_integer_many()",&local_170,"");
            bVar1 = trial::protocol::json::basic_reader<char>::next(&local_160);
            local_170._M_len = CONCAT71(local_170._M_len._1_7_,bVar1);
            local_174 = local_174 & 0xffffff00;
            boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
                      ("reader.next()","false",
                       "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                       ,0x16e,"void array_suite::test_integer_many()",&local_170,&local_174);
            local_170._M_len = CONCAT44(local_170._M_len._4_4_,local_160.decoder.current.code);
            local_174 = 0;
            boost::detail::
            test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
                      ("reader.code()","token::code::end",
                       "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                       ,0x16f,"void array_suite::test_integer_many()",&local_170,&local_174);
            if ((long)local_160.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_160.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_start != 0) {
              local_170._M_len =
                   ((long)local_160.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_160.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
              local_174 = 0;
              boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
                        ("reader.level()","0",
                         "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
                         ,0x170,"void array_suite::test_integer_many()",&local_170,&local_174);
              if (local_160.stack.c.
                  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_160.stack.c.
                                super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_160.stack.c.
                                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_160.stack.c.
                                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              return;
            }
          }
        }
      }
    }
  }
  __assert_fail("stack.size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/cmake/../include/trial/protocol/json/detail/reader.ipp"
                ,0x107,
                "size_type trial::protocol::json::basic_reader<char>::level() const [CharT = char]")
  ;
}

Assistant:

void test_integer_many()
{
    const char input[] = "[1,2,3]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "[");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "1,2,3]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<int>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "1");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), ",2,3]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<int>(), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "2");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), ",3]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<int>(), 3);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "3");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "]");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 0);
}